

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

RealType __thiscall OpenMD::Thermo::getTaggedAtomPairDistance(Thermo *this)

{
  bool bVar1;
  SnapshotManager *this_00;
  Vector<double,_3U> *in_RDI;
  StuntDouble *at2;
  StuntDouble *at1;
  Vector3d rab;
  Vector3d pos2;
  Vector3d pos1;
  pair<int,_int> tap;
  Globals *simParams;
  Snapshot *currSnapshot;
  Globals *in_stack_ffffffffffffff28;
  SimInfo *in_stack_ffffffffffffff38;
  Vector3d *in_stack_ffffffffffffffa8;
  Snapshot *in_stack_ffffffffffffffb0;
  double local_8;
  
  this_00 = SimInfo::getSnapshotManager((SimInfo *)((Vector<double,_3U> *)in_RDI->data_)->data_[0]);
  SnapshotManager::getCurrentSnapshot(this_00);
  SimInfo::getSimParams((SimInfo *)((Vector<double,_3U> *)in_RDI->data_)->data_[0]);
  bVar1 = Globals::haveTaggedAtomPair((Globals *)0x174ce9);
  if ((bVar1) && (bVar1 = Globals::havePrintTaggedPairDistance((Globals *)0x174cff), bVar1)) {
    bVar1 = Globals::getPrintTaggedPairDistance((Globals *)0x174d15);
    if (bVar1) {
      Globals::getTaggedAtomPair(in_stack_ffffffffffffff28);
      Vector3<double>::Vector3((Vector3<double> *)0x174d40);
      Vector3<double>::Vector3((Vector3<double> *)0x174d4d);
      Vector3<double>::Vector3((Vector3<double> *)0x174d57);
      SimInfo::getIOIndexToIntegrableObject(in_stack_ffffffffffffff38,(int)((ulong)in_RDI >> 0x20));
      SimInfo::getIOIndexToIntegrableObject(in_stack_ffffffffffffff38,(int)((ulong)in_RDI >> 0x20));
      StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffff38);
      Vector3<double>::operator=
                ((Vector3<double> *)in_RDI,(Vector3<double> *)in_stack_ffffffffffffff28);
      StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffff38);
      Vector3<double>::operator=
                ((Vector3<double> *)in_RDI,(Vector3<double> *)in_stack_ffffffffffffff28);
      OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffff38,in_RDI);
      Vector3<double>::operator=((Vector3<double> *)in_stack_ffffffffffffff38,in_RDI);
      Snapshot::wrapVector(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      local_8 = Vector<double,_3U>::length((Vector<double,_3U> *)0x174e13);
    }
    else {
      local_8 = 0.0;
    }
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

RealType Thermo::getTaggedAtomPairDistance() {
    Snapshot* currSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    Globals* simParams     = info_->getSimParams();

    if (simParams->haveTaggedAtomPair() &&
        simParams->havePrintTaggedPairDistance()) {
      if (simParams->getPrintTaggedPairDistance()) {
        pair<int, int> tap = simParams->getTaggedAtomPair();
        Vector3d pos1, pos2, rab;

#ifdef IS_MPI
        int mol1 = info_->getGlobalMolMembership(tap.first);
        int mol2 = info_->getGlobalMolMembership(tap.second);

        int proc1 = info_->getMolToProc(mol1);
        int proc2 = info_->getMolToProc(mol2);

        RealType data[3];
        if (proc1 == worldRank) {
          StuntDouble* sd1 = info_->getIOIndexToIntegrableObject(tap.first);
          pos1             = sd1->getPos();
          data[0]          = pos1.x();
          data[1]          = pos1.y();
          data[2]          = pos1.z();
          MPI_Bcast(data, 3, MPI_REALTYPE, proc1, MPI_COMM_WORLD);
        } else {
          MPI_Bcast(data, 3, MPI_REALTYPE, proc1, MPI_COMM_WORLD);
          pos1 = Vector3d(data);
        }

        if (proc2 == worldRank) {
          StuntDouble* sd2 = info_->getIOIndexToIntegrableObject(tap.second);
          pos2             = sd2->getPos();
          data[0]          = pos2.x();
          data[1]          = pos2.y();
          data[2]          = pos2.z();
          MPI_Bcast(data, 3, MPI_REALTYPE, proc2, MPI_COMM_WORLD);
        } else {
          MPI_Bcast(data, 3, MPI_REALTYPE, proc2, MPI_COMM_WORLD);
          pos2 = Vector3d(data);
        }
#else
        StuntDouble* at1 = info_->getIOIndexToIntegrableObject(tap.first);
        StuntDouble* at2 = info_->getIOIndexToIntegrableObject(tap.second);
        pos1             = at1->getPos();
        pos2             = at2->getPos();
#endif
        rab = pos2 - pos1;
        currSnapshot->wrapVector(rab);
        return rab.length();
      }
      return 0.0;
    }
    return 0.0;
  }